

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O2

void h265e_dpb_set_ref_list(H265eDpb *dpb,H265eSlice *slice,RK_S32 delta_poc)

{
  H265eRefPicListModification *pHVar1;
  int iVar2;
  long lVar3;
  char *fmt;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int local_3c;
  
  pHVar1 = (dpb->RpsList).m_RefPicListModification;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_set_ref_list");
  }
  pHVar1->m_refPicListModificationFlagL1 = 0;
  for (lVar3 = 2; lVar3 != 0x22; lVar3 = lVar3 + 1) {
    pHVar1->m_RefPicSetIdxL0[lVar3 + -2] = 0;
  }
  pHVar1->m_refPicListModificationFlagL0 = 0;
  iVar2 = (slice->m_localRPS).m_numberOfPictures;
  if (1 < iVar2) {
    local_3c = -1;
    iVar6 = 0;
    iVar7 = 0;
    for (uVar5 = 0; (long)uVar5 < (long)iVar2; uVar5 = uVar5 + 1) {
      if (((byte)h265e_debug & 0x80) != 0) {
        _mpp_log_l(4,"h265e_dpb","m_pRps->delta_poc[%d] = %d",(char *)0x0,uVar5 & 0xffffffff,
                   (ulong)(uint)(slice->m_localRPS).delta_poc[uVar5]);
        iVar2 = (slice->m_localRPS).m_numberOfPictures;
      }
      if ((slice->m_localRPS).delta_poc[uVar5] == delta_poc) {
        lVar3 = (long)(~(slice->m_localRPS).num_long_term_pic + iVar2);
        iVar6 = iVar6 + (uint)((long)uVar5 <= lVar3);
        iVar7 = iVar7 + (uint)(lVar3 < (long)uVar5);
        local_3c = (int)uVar5;
        if (((byte)h265e_debug & 0x80) != 0) {
          pcVar4 = "lt";
          if (iVar6 != 0) {
            pcVar4 = "st";
          }
          _mpp_log_l(4,"h265e_dpb","get %s ref ref_idx %d delta_poc %d",(char *)0x0,pcVar4,
                     uVar5 & 0xffffffff,delta_poc);
          iVar2 = (slice->m_localRPS).m_numberOfPictures;
        }
      }
    }
    if ((iVar7 != 1) && (iVar6 == 0)) {
      fmt = "Warning: Did not find the right long term reference picture or more than one.";
      iVar2 = 2;
      pcVar4 = (char *)0x0;
      goto LAB_001c097b;
    }
    if (local_3c != 0) {
      pHVar1->m_refPicListModificationFlagL0 = 1;
      calc_ref_pic_set_idxl0(dpb,slice,local_3c);
    }
  }
  pHVar1->m_refPicListModificationFlagL1 = 0;
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  fmt = "leave\n";
  pcVar4 = "h265e_dpb_set_ref_list";
  iVar2 = 4;
LAB_001c097b:
  _mpp_log_l(iVar2,"h265e_dpb",fmt,pcVar4);
  return;
}

Assistant:

void h265e_dpb_set_ref_list(H265eDpb *dpb, H265eSlice *slice, RK_S32 delta_poc)
{
    RK_S32 i;
    RK_S32 ref_idx = -1;
    RK_S32 lt_cnt = 0, st_cnt = 0;
    H265eRpsList *RpsList = &dpb->RpsList;
    H265eReferencePictureSet * m_pRps = (H265eReferencePictureSet*)&slice->m_localRPS;
    H265eRefPicListModification* refPicListModification = RpsList->m_RefPicListModification;

    h265e_dbg_func("enter\n");
    refPicListModification->m_refPicListModificationFlagL0 = 0;
    refPicListModification->m_refPicListModificationFlagL1 = 0;

    for (i = 0; i < REF_PIC_LIST_NUM_IDX; i ++) {
        refPicListModification->m_RefPicSetIdxL0[i] = 0;
        refPicListModification->m_RefPicSetIdxL0[i] = 0;
    }

    refPicListModification->m_refPicListModificationFlagL0 = 0;

    if (m_pRps->m_numberOfPictures > 1) {
        for (i = 0; i < m_pRps->m_numberOfPictures; i++) {
            h265e_dbg_dpb("m_pRps->delta_poc[%d] = %d", i, m_pRps->delta_poc[i]);
            if (m_pRps->delta_poc[i] == delta_poc) {
                ref_idx = i;
                if (i > m_pRps->m_numberOfPictures - m_pRps->num_long_term_pic - 1)
                    lt_cnt++;
                else
                    st_cnt++;
                h265e_dbg_dpb("get %s ref ref_idx %d delta_poc %d", st_cnt ? "st" : "lt", ref_idx, delta_poc);
            }
        }
        if (lt_cnt != 1 && st_cnt == 0) {
            mpp_err("Warning: Did not find the right long term reference picture or more than one.");
            return;
        } else if (ref_idx != 0) {
            refPicListModification->m_refPicListModificationFlagL0 = 1;
            calc_ref_pic_set_idxl0(dpb, slice, ref_idx);
        }
    }
    refPicListModification->m_refPicListModificationFlagL1 = 0;
    h265e_dbg_func("leave\n");
}